

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t tree_enter_initial_dir(tree *t)

{
  wchar_t local_14;
  wchar_t r;
  tree *t_local;
  
  local_14 = L'\0';
  if (((t->flags & 0x100U) == 0) && (local_14 = fchdir(t->initial_dir_fd), local_14 == L'\0')) {
    t->flags = t->flags & 0xffffffbf;
    t->flags = t->flags | 0x100;
  }
  return local_14;
}

Assistant:

static int
tree_enter_initial_dir(struct tree *t)
{
	int r = 0;

	if ((t->flags & onInitialDir) == 0) {
		r = fchdir(t->initial_dir_fd);
		if (r == 0) {
			t->flags &= ~onWorkingDir;
			t->flags |= onInitialDir;
		}
	}
	return (r);
}